

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

void release(void)

{
  GLboolean GVar1;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 1; local_c = local_c + 1) {
    if (g_gl.clocks[local_c] != (djg_clock *)0x0) {
      djgc_release(g_gl.clocks[local_c]);
    }
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    if (g_gl.streams[local_c] != (djg_buffer *)0x0) {
      djgb_release(g_gl.streams[local_c]);
    }
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    GVar1 = (*glad_glIsProgram)(g_gl.programs[local_c]);
    if (GVar1 != '\0') {
      (*glad_glDeleteProgram)(g_gl.programs[local_c]);
    }
  }
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    GVar1 = (*glad_glIsTexture)(g_gl.textures[local_c]);
    if (GVar1 != '\0') {
      (*glad_glDeleteTextures)(1,(GLuint *)((long)local_c * 4 + 0x276e84));
    }
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    GVar1 = (*glad_glIsBuffer)(g_gl.buffers[local_c]);
    if (GVar1 != '\0') {
      (*glad_glDeleteBuffers)(1,(GLuint *)((long)local_c * 4 + 0x276ea4));
    }
  }
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    GVar1 = (*glad_glIsFramebuffer)(g_gl.framebuffers[local_c]);
    if (GVar1 != '\0') {
      (*glad_glDeleteFramebuffers)(1,(GLuint *)((long)local_c * 4 + 0x276e7c));
    }
  }
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    GVar1 = (*glad_glIsVertexArray)(g_gl.vertexArrays[local_c]);
    if (GVar1 != '\0') {
      (*glad_glDeleteVertexArrays)(1,(GLuint *)((long)local_c * 4 + 0x276e9c));
    }
  }
  return;
}

Assistant:

void release()
{
    int i;

    for (i = 0; i < CLOCK_COUNT; ++i)
        if (g_gl.clocks[i])
            djgc_release(g_gl.clocks[i]);
    for (i = 0; i < STREAM_COUNT; ++i)
        if (g_gl.streams[i])
            djgb_release(g_gl.streams[i]);
    for (i = 0; i < PROGRAM_COUNT; ++i)
        if (glIsProgram(g_gl.programs[i]))
            glDeleteProgram(g_gl.programs[i]);
    for (i = 0; i < TEXTURE_COUNT; ++i)
        if (glIsTexture(g_gl.textures[i]))
            glDeleteTextures(1, &g_gl.textures[i]);
    for (i = 0; i < BUFFER_COUNT; ++i)
        if (glIsBuffer(g_gl.buffers[i]))
            glDeleteBuffers(1, &g_gl.buffers[i]);
    for (i = 0; i < FRAMEBUFFER_COUNT; ++i)
        if (glIsFramebuffer(g_gl.framebuffers[i]))
            glDeleteFramebuffers(1, &g_gl.framebuffers[i]);
    for (i = 0; i < VERTEXARRAY_COUNT; ++i)
        if (glIsVertexArray(g_gl.vertexArrays[i]))
            glDeleteVertexArrays(1, &g_gl.vertexArrays[i]);
}